

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O1

archive_result_type<pstore::serialize::archive::database_writer>
pstore::serialize::string_helper::
write<pstore::serialize::archive::database_writer,pstore::sstring_view<std::shared_ptr<char_const>>>
          (database_writer *archive,sstring_view<std::shared_ptr<const_char>_> *str)

{
  element_type *peVar1;
  uchar *puVar2;
  result_type rVar3;
  long lVar4;
  span<unsigned_char,__1L> sp;
  span<const_char,__1L> sp_00;
  array<unsigned_char,_9UL> encoded_length;
  extent_type<_1L> local_40 [2];
  uchar local_29 [9];
  
  puVar2 = varint::encode<unsigned_char*>(str->size_,local_29);
  lVar4 = (long)puVar2 - (long)local_29;
  if (0xfffffffffffffff6 < lVar4 - 10U) {
    if (lVar4 == 1) {
      *puVar2 = '\0';
      puVar2 = puVar2 + 1;
    }
    gsl::details::extent_type<-1L>::extent_type(local_40,(long)puVar2 - (long)local_29);
    sp.storage_.data_ = local_29;
    sp.storage_.super_extent_type<_1L>.size_ = local_40[0].size_;
    rVar3 = serialize::archive::
            writer_base<pstore::serialize::archive::details::database_writer_policy>::
            putn<pstore::gsl::span<unsigned_char,_1l>>
                      (&archive->
                        super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                       ,sp);
    peVar1 = (str->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    gsl::details::extent_type<-1L>::extent_type(local_40,str->size_);
    sp_00.storage_.data_ = peVar1;
    sp_00.storage_.super_extent_type<_1L>.size_ = local_40[0].size_;
    serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>::
    putn<pstore::gsl::span<char_const,_1l>>
              (&archive->
                super_writer_base<pstore::serialize::archive::details::database_writer_policy>,sp_00
              );
    return (archive_result_type<pstore::serialize::archive::database_writer>)rVar3.a_;
  }
  assert_failed("length_bytes > 0 && static_cast<std::size_t> (length_bytes) <= encoded_length.size ()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                ,0x3e);
}

Assistant:

static auto write (Archive && archive, StringType const & str)
                -> archive_result_type<Archive> {
                auto const length = str.length ();

                // Encode the string length as a variable-length integer.
                std::array<std::uint8_t, varint::max_output_length> encoded_length;
                auto first = std::begin (encoded_length);
                auto last = varint::encode (length, first);
                auto length_bytes = std::distance (first, last);
                PSTORE_ASSERT (length_bytes > 0 &&
                               static_cast<std::size_t> (length_bytes) <= encoded_length.size ());
                if (length_bytes == 1) {
                    *(last++) = 0;
                }
                // Emit the string length.
                auto const resl = serialize::write (archive, gsl::make_span (&(*first), &(*last)));

                // Emit the string body.
                serialize::write (archive, gsl::make_span (str));
                return resl;
            }